

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

ps_type_t ps_config_typeof(ps_config_t *config,char *name)

{
  int32 iVar1;
  void *local_28;
  void *val;
  char *name_local;
  ps_config_t *config_local;
  
  val = name;
  name_local = (char *)config;
  iVar1 = hash_table_lookup(config->ht,name,&local_28);
  if (iVar1 < 0) {
    config_local._4_4_ = 0;
  }
  else if (local_28 == (void *)0x0) {
    config_local._4_4_ = 0;
  }
  else {
    config_local._4_4_ = *(ps_type_t *)((long)local_28 + 8);
  }
  return config_local._4_4_;
}

Assistant:

ps_type_t
ps_config_typeof(ps_config_t *config, char const *name)
{
    void *val;
    if (hash_table_lookup(config->ht, name, &val) < 0)
        return 0;
    if (val == NULL)
        return 0;
    return ((cmd_ln_val_t *)val)->type;
}